

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

void __thiscall TRootHandler_MNDX::~TRootHandler_MNDX(TRootHandler_MNDX *this)

{
  TMndxMarFile *this_00;
  undefined8 *puVar1;
  long lVar2;
  ulong ItemIndex;
  
  (this->super_TRootHandler)._vptr_TRootHandler = (_func_int **)&PTR__TRootHandler_MNDX_0012e9b0;
  for (lVar2 = 10; lVar2 != 0xd; lVar2 = lVar2 + 1) {
    this_00 = *(TMndxMarFile **)((this->MndxInfo).RootFileName + lVar2 * 8 + -0x10);
    if (this_00 != (TMndxMarFile *)0x0) {
      TMndxMarFile::~TMndxMarFile(this_00);
    }
    operator_delete(this_00,0x18);
  }
  free(this->ppValidEntries);
  free(this->pMndxEntries);
  for (ItemIndex = 0; ItemIndex < (this->Packages).m_ItemCount; ItemIndex = ItemIndex + 1) {
    puVar1 = (undefined8 *)CASC_ARRAY::ItemAt(&this->Packages,ItemIndex);
    free((void *)*puVar1);
  }
  CASC_ARRAY::Free(&this->Packages);
  TRootHandler::~TRootHandler(&this->super_TRootHandler);
  return;
}

Assistant:

~TRootHandler_MNDX()
    {
        PMNDX_PACKAGE pPackage;
        size_t i;

        for(i = 0; i < MAX_MAR_FILES; i++)
            delete MndxInfo.MarFiles[i];
        if(ppValidEntries != NULL)
            CASC_FREE(ppValidEntries);
        if(pMndxEntries != NULL)
            CASC_FREE(pMndxEntries);

        for(i = 0; i < Packages.ItemCount(); i++)
        {
            pPackage = (PMNDX_PACKAGE)Packages.ItemAt(i);
            CASC_FREE(pPackage->szFileName);
        }
        Packages.Free();
    }